

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

uint ON_MeshNgon::FindNgonBoundaries
               (ON_3dPointListRef *mesh_vertex_list,ON_MeshFaceList *mesh_face_list,
               ON_MeshVertexFaceMap *vertex_face_map,size_t ngon_fi_count,uint *ngon_fi,
               ON_SimpleArray<unsigned_int> *ngon_vi,ON_SimpleArray<unsigned_int> *ngon_vi_markers)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint face_index_count;
  bool bVar4;
  double dVar5;
  ON_SimpleArray<unsigned_int> ngon_vi1;
  ON_SimpleArray<unsigned_int> tmp;
  double local_130;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  ON_3dVector local_f8;
  ON_3dVector B;
  ON_3dVector A;
  ON_Plane ngon_plane;
  
  uVar1 = mesh_vertex_list->m_point_count;
  if ((1 < uVar1 + 1) && (ngon_fi != (uint *)0x0 && ngon_fi_count != 0)) {
    ngon_nbr_map._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00826fa0;
    ngon_nbr_map.m_a = (NgonNeighbors *)0x0;
    ngon_nbr_map.m_count = 0;
    ngon_nbr_map.m_capacity = 0;
    face_index_count = (uint)ngon_fi_count;
    ON_SimpleArray<NgonNeighbors>::Reserve(&ngon_nbr_map,ngon_fi_count & 0xffffffff);
    if ((-1 < (int)face_index_count) && ((int)face_index_count <= ngon_nbr_map.m_capacity)) {
      ngon_nbr_map.m_count = face_index_count;
    }
    uVar1 = SetFaceNeighborMap(uVar1,mesh_face_list,(uint **)0x0,vertex_face_map,face_index_count,
                               ngon_fi,ngon_nbr_map.m_a);
    if (-1 < ngon_vi->m_capacity) {
      ngon_vi->m_count = 0;
    }
    uVar2 = GetNgonBoundarySegments
                      (mesh_face_list,face_index_count,ngon_fi,1,ngon_nbr_map.m_a,ngon_vi,
                       (ON_SimpleArray<unsigned_int> *)0x0);
    if (uVar2 != 0) {
      ngon_plane.origin.x._0_4_ = ngon_vi->m_count;
      ON_SimpleArray<unsigned_int>::Append(ngon_vi_markers,(uint *)&ngon_plane);
      vertex_face_map = (ON_MeshVertexFaceMap *)(ulong)(uint)ngon_vi->m_count;
      if ((uint)ngon_vi->m_count < uVar1) {
        tmp._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
        tmp.m_a = (uint *)0x0;
        tmp.m_count = 0;
        tmp.m_capacity = 0;
        ON_3dPointListRef::operator[](&ngon_plane.origin,mesh_vertex_list,ngon_vi->m_a[1]);
        ON_3dPointListRef::operator[]((ON_3dPoint *)&B,mesh_vertex_list,*ngon_vi->m_a);
        ON_3dPoint::operator-(&A,&ngon_plane.origin,(ON_3dPoint *)&B);
        ON_3dPointListRef::operator[]
                  (&ngon_plane.origin,mesh_vertex_list,ngon_vi->m_a[(long)ngon_vi->m_count + -1]);
        ON_3dPointListRef::operator[]((ON_3dPoint *)&ngon_vi1,mesh_vertex_list,*ngon_vi->m_a);
        ON_3dPoint::operator-(&B,&ngon_plane.origin,(ON_3dPoint *)&ngon_vi1);
        ON_3dVector::Unitize(&A);
        ON_3dVector::Unitize(&B);
        ON_3dPointListRef::operator[]((ON_3dPoint *)&ngon_vi1,mesh_vertex_list,*ngon_vi->m_a);
        ON_CrossProduct(&local_f8,&A,&B);
        ON_Plane::ON_Plane(&ngon_plane,(ON_3dPoint *)&ngon_vi1,&local_f8);
        local_130 = Internal_NgonBoundaryArea(&ngon_plane,mesh_vertex_list,ngon_vi);
        uVar1 = 2;
        do {
          ngon_vi1._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
          ngon_vi1.m_a = (uint *)0x0;
          ngon_vi1.m_count = 0;
          ngon_vi1.m_capacity = 0;
          uVar3 = GetNgonBoundarySegments
                            (mesh_face_list,face_index_count,ngon_fi,uVar1,ngon_nbr_map.m_a,
                             &ngon_vi1,(ON_SimpleArray<unsigned_int> *)0x0);
          bVar4 = 2 < (uint)ngon_vi1.m_count;
          if (bVar4 && uVar3 != 0) {
            dVar5 = Internal_NgonBoundaryArea(&ngon_plane,mesh_vertex_list,&ngon_vi1);
            if (dVar5 <= local_130) {
              local_f8.x._0_4_ = ngon_vi1.m_count;
              ON_SimpleArray<unsigned_int>::Append(ngon_vi_markers,(uint *)&local_f8);
              ON_SimpleArray<unsigned_int>::Append(ngon_vi,ngon_vi1.m_count,ngon_vi1.m_a);
            }
            else {
              if (tmp.m_a != (uint *)0x0) {
                memset(tmp.m_a,0,(long)tmp.m_capacity << 2);
              }
              tmp._16_8_ = tmp._16_8_ & 0xffffffff00000000;
              ON_SimpleArray<unsigned_int>::Append(&tmp,ngon_vi1.m_count,ngon_vi1.m_a);
              ON_SimpleArray<unsigned_int>::Append(&tmp,ngon_vi->m_count,ngon_vi->m_a);
              ON_SimpleArray<unsigned_int>::operator=(ngon_vi,&tmp);
              local_f8.x._0_4_ = ngon_vi1.m_count;
              ON_SimpleArray<unsigned_int>::Insert(ngon_vi_markers,0,(uint *)&local_f8);
              local_130 = dVar5;
            }
          }
          ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&ngon_vi1);
          uVar1 = uVar1 + 1;
        } while (bVar4 && uVar3 != 0);
        ON_Plane::~ON_Plane(&ngon_plane);
        ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&tmp);
        vertex_face_map = (ON_MeshVertexFaceMap *)(ulong)(uint)ngon_vi->m_count;
      }
    }
    ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&ngon_nbr_map);
    if (uVar2 != 0) {
      return (uint)vertex_face_map;
    }
  }
  if (-1 < ngon_vi->m_capacity) {
    ngon_vi->m_count = 0;
  }
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::FindNgonBoundaries(
  const class ON_3dPointListRef& mesh_vertex_list,
  const class ON_MeshFaceList& mesh_face_list,
  ON_MeshVertexFaceMap* vertex_face_map,
  size_t ngon_fi_count,
  const unsigned int* ngon_fi,
  ON_SimpleArray<unsigned int>& ngon_vi,
  ON_SimpleArray<unsigned int>& ngon_vi_markers
)
{
  return FindNgonBoundaries_Helper(
    mesh_vertex_list,
    mesh_face_list,
    nullptr,
    vertex_face_map,
    ngon_fi_count,
    ngon_fi,
    ngon_vi,
    ngon_vi_markers,
    false
  );
}